

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

void memory_tree_ns::learn(memory_tree *b,single_learner *base,example *ec)

{
  int iVar1;
  example **ppeVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  ostream *poVar6;
  clock_t cVar7;
  clock_t cVar8;
  bool bVar9;
  double dVar10;
  example *new_ec;
  uint32_t local_3c;
  example *local_38;
  
  bVar9 = b->test_mode == false;
  if (bVar9) {
    b->iter = b->iter + 1;
    predict(b,base,ec);
    if ((b->iter * 0x3afb7e91 + 0x346dc0U >> 3 | b->iter * 0x20000000) < 0xd1b71) {
      iVar1 = b->oas;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"at iter ",8);
      poVar6 = (ostream *)std::ostream::operator<<(&std::cout,b->iter);
      if (iVar1 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", top(",6);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,b->top_K);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") pred error: ",0xe);
        poVar6 = std::ostream::_M_insert<double>((double)b->num_mistakes / (double)b->iter);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,", total num queires so far: ",0x1c);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", max depth: ",0xd);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", max exp in leaf: ",0x13);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", avg hamming loss: ",0x14);
        poVar6 = std::ostream::_M_insert<double>((double)b->hamming_loss / (double)b->iter);
      }
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    cVar7 = clock();
    if (b->current_pass == 0) {
      local_38 = calloc_or_throw<example>(1);
      copy_example_data(local_38,ec,b->oas);
      v_array<example_*>::push_back(&b->examples,&local_38);
      if (b->online == 1) {
        ppeVar2 = (b->examples)._end;
        local_3c = (int)((ulong)((long)ppeVar2 - (long)(b->examples)._begin) >> 3) - 1;
        single_query_and_learn(b,base,&local_3c,ppeVar2[-1]);
      }
      local_3c = (int)((ulong)((long)(b->examples)._end - (long)(b->examples)._begin) >> 3) - 1;
      uVar5 = 0;
      insert_example(b,base,&local_3c,false);
      if (b->dream_repeats != 0) {
        do {
          experience_replay(b,base);
          uVar5 = uVar5 + 1;
        } while (uVar5 < b->dream_repeats);
      }
    }
    else {
      ppeVar2 = (b->examples)._begin;
      uVar5 = 0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)(b->examples)._end - (long)ppeVar2 >> 3;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (long)b->iter;
      local_38 = (example *)CONCAT44(local_38._4_4_,SUB164(auVar4 % auVar3,0));
      single_query_and_learn(b,base,(uint32_t *)&local_38,ppeVar2[SUB168(auVar4 % auVar3,0)]);
      if (b->dream_repeats != 0) {
        do {
          experience_replay(b,base);
          uVar5 = uVar5 + 1;
        } while (uVar5 < b->dream_repeats);
      }
    }
    cVar8 = clock();
    b->construct_time = (float)((double)b->construct_time + (double)(cVar8 - cVar7) / 1000000.0);
  }
  else if (!bVar9) {
    iVar1 = b->iter;
    b->iter = iVar1 + 1;
    uVar5 = iVar1 * 0x3afb7e91 + 0x3b2fec51;
    if ((uVar5 >> 3 | uVar5 * 0x20000000) < 0xd1b71) {
      iVar1 = b->oas;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"at iter ",8);
      poVar6 = (ostream *)std::ostream::operator<<(&std::cout,b->iter);
      if (iVar1 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", pred error: ",0xe);
        dVar10 = (double)b->num_mistakes;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", avg hamming loss: ",0x14);
        dVar10 = (double)b->hamming_loss;
      }
      poVar6 = std::ostream::_M_insert<double>(dVar10 / (double)b->iter);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    cVar7 = clock();
    predict(b,base,ec);
    cVar8 = clock();
    b->test_time = (float)((double)b->test_time + (double)(cVar8 - cVar7) / 1000000.0);
  }
  return;
}

Assistant:

void learn(memory_tree& b, single_learner& base, example& ec)
    {        
        if (b.test_mode == false){
            b.iter++;
            predict(b, base, ec);
            
            if (b.iter%5000 == 0){
                if (b.oas == false)
	                cout<<"at iter "<<b.iter<<", top("<<b.top_K<<") pred error: "<<b.num_mistakes*1./b.iter<<", total num queires so far: "<<b.total_num_queries<<", max depth: "<<b.max_depth<<", max exp in leaf: "<<b.max_ex_in_leaf<<endl;
                else
                    cout<<"at iter "<<b.iter<<", avg hamming loss: "<<b.hamming_loss*1./b.iter<<endl;
            }

            clock_t begin = clock();
        
            if (b.current_pass < 1){ //in the first pass, we need to store the memory:
                example* new_ec = &calloc_or_throw<example>();
                copy_example_data(new_ec, &ec, b.oas);
                b.examples.push_back(new_ec);   
                if(b.online == true)
                    update_rew(b, base, b.examples.size() - 1,*b.examples[b.examples.size()-1]); //query and learn
                
                insert_example(b, base, b.examples.size() - 1); //unsupervised learning. 
                for (uint32_t i = 0; i < b.dream_repeats; i++)
                    experience_replay(b, base);
            }
            else{ //starting from the current pass, we just learn using reinforcement signal, no insertion needed:
                size_t ec_id = (b.iter)%b.examples.size();
                update_rew(b, base, ec_id, *b.examples[ec_id]); //no insertion will happen in this call
		        for (uint32_t i = 0; i < b.dream_repeats; i++)
		            experience_replay(b, base);
            }
            b.construct_time += double(clock() - begin)/CLOCKS_PER_SEC;   
        }
        else if (b.test_mode == true){
            b.iter++;
            if (b.iter % 5000 == 0){
                if(b.oas == false)
                    cout<<"at iter "<<b.iter<<", pred error: "<<b.num_mistakes*1./b.iter<<endl;
                else
                    cout<<"at iter "<<b.iter<<", avg hamming loss: "<<b.hamming_loss*1./b.iter<<endl;
            }
            clock_t begin = clock();
            predict(b, base, ec);
            b.test_time += double(clock() - begin)/CLOCKS_PER_SEC;
        }

    }